

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O3

Impl * kj::_::FiberStack::Impl::alloc(size_t stackSize,ucontext_t *context)

{
  ucontext_t *puVar1;
  SyscallResult SVar2;
  size_t sVar3;
  void *pvVar4;
  ucontext_t *in_RSI;
  size_t in_RDI;
  Fault f_1;
  Fault f;
  void *stack;
  void *stackMapping;
  size_t allocSize;
  UnwindDetector _kjUnwindDetector1414;
  Fault local_80;
  anon_class_16_2_8fad328a local_78;
  size_t local_68;
  ucontext_t *local_60;
  ucontext_t *local_58;
  void *local_50;
  size_t local_48;
  UnwindDetector local_3c;
  NullableValue<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_c__:1412:5)>
  local_38;
  
  local_68 = in_RDI;
  local_58 = in_RSI;
  sVar3 = getPageSize();
  local_48 = in_RDI + sVar3;
  pvVar4 = mmap((void *)0x0,local_48,0,0x22,-1,0);
  local_50 = pvVar4;
  if (pvVar4 == (void *)0xffffffffffffffff) {
    __errno_location();
    local_78.stack = (void **)0x0;
    local_38.isSet = false;
    local_38._1_7_ = 0;
    local_38.field_1.value._kjUnwindDetector1414 = (UnwindDetector *)0x0;
    Debug::Fault::init((Fault *)&local_78,
                       (EVP_PKEY_CTX *)
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
                      );
    Debug::Fault::fatal((Fault *)&local_78);
  }
  UnwindDetector::UnwindDetector(&local_3c);
  local_38.isSet = true;
  local_38.field_1.value.stackMapping = &local_50;
  local_38.field_1.value.allocSize = &local_48;
  local_60 = (ucontext_t *)((long)pvVar4 + sVar3);
  local_78.stack = &local_60;
  local_78.stackSize = &local_68;
  local_38.field_1.value._kjUnwindDetector1414 = &local_3c;
  SVar2 = Debug::syscall<kj::_::FiberStack::Impl::alloc(unsigned_long,ucontext_t*)::_lambda()_2_>
                    (&local_78,false);
  puVar1 = local_60;
  sVar3 = local_68;
  if (SVar2.errorNumber == 0) {
    local_78.stack = &local_58;
    SVar2 = Debug::syscall<kj::_::FiberStack::Impl::alloc(unsigned_long,ucontext_t*)::_lambda()_3_>
                      ((anon_class_8_1_bc11688f *)&local_78,false);
    if (SVar2.errorNumber == 0) {
      (local_58->uc_stack).ss_size = local_68 - 400;
      (local_58->uc_stack).ss_sp = local_60;
      (local_58->uc_stack).ss_flags = 0;
      local_58->uc_link = (ucontext_t *)0x0;
      Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++:1412:5)>
      ::run((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_c__:1412:5)>
             *)&local_38);
      return (Impl *)((long)puVar1 + (sVar3 - 400));
    }
    local_80.exception = (Exception *)0x0;
    local_78.stack = (void **)0x0;
    local_78.stackSize = (size_t *)0x0;
    Debug::Fault::init(&local_80,
                       (EVP_PKEY_CTX *)
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
                      );
    Debug::Fault::fatal(&local_80);
  }
  local_80.exception = (Exception *)0x0;
  local_78.stack = (void **)0x0;
  local_78.stackSize = (size_t *)0x0;
  Debug::Fault::init(&local_80,
                     (EVP_PKEY_CTX *)
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
                    );
  Debug::Fault::fatal(&local_80);
}

Assistant:

static Impl* alloc(size_t stackSize, ucontext_t* context) {
#ifndef MAP_ANONYMOUS
#define MAP_ANONYMOUS MAP_ANON
#endif
    size_t pageSize = getPageSize();
    size_t allocSize = stackSize + pageSize;  // size plus guard page and impl

    // Allocate virtual address space for the stack but make it inaccessible initially.
    // TODO(someday): Does it make sense to use MAP_GROWSDOWN on Linux? It's a kind of bizarre flag
    //   that causes the mapping to automatically allocate extra pages (beyond the range specified)
    //   until it hits something... Note that on FreeBSD, MAP_STACK has the effect that
    //   MAP_GROWSDOWN has on Linux. (MAP_STACK, meanwhile, has no effect on Linux.)
    void* stackMapping = mmap(nullptr, allocSize, PROT_NONE,
        MAP_ANONYMOUS | MAP_PRIVATE, -1, 0);
    if (stackMapping == MAP_FAILED) {
      KJ_FAIL_SYSCALL("mmap(new stack)", errno);
    }
    KJ_ON_SCOPE_FAILURE({
      KJ_SYSCALL(munmap(stackMapping, allocSize)) { break; }
    });

#if __linux__
#if defined(PR_SET_VMA) && defined(PR_SET_VMA_ANON_NAME)
    // Try to name the virtual memory area for debugging purposes. This may fail if the kernel was
    // not configured with the CONFIG_ANON_VMA_NAME option.
    prctl(PR_SET_VMA, PR_SET_VMA_ANON_NAME, stackMapping, allocSize, "kj_fiber_stack");
#endif
#endif

    void* stack = reinterpret_cast<byte*>(stackMapping) + pageSize;
    // Now mark everything except the guard page as read-write. We assume the stack grows down, so
    // the guard page is at the beginning. No modern architecture uses stacks that grow up.
    KJ_SYSCALL(mprotect(stack, stackSize, PROT_READ | PROT_WRITE));

    // Stick `Impl` at the top of the stack.
    Impl* impl = (reinterpret_cast<Impl*>(reinterpret_cast<byte*>(stack) + stackSize) - 1);

    // Note: mmap() allocates zero'd pages so we don't have to memset() anything here.

    KJ_SYSCALL(getcontext(context));
#if __APPLE__ && __aarch64__
    // Per issue #1386, apple on arm64 zeros the entire configured stack.
    // But this is redundant, since we just allocated the stack with mmap() which
    // returns zero'd pages. Re-zeroing is both slow and results in prematurely
    // allocating pages we may not need -- it's normal for stacks to rely heavily
    // on lazy page allocation to avoid wasting memory. Instead, we lie:
    // we allocate the full size, but tell the ucontext the stack is the last
    // page only. This appears to work as no particular bounds checks or
    // anything are set up based on what we say here.
    context->uc_stack.ss_size = min(pageSize, stackSize) - sizeof(Impl);
    context->uc_stack.ss_sp = reinterpret_cast<char*>(stack) + stackSize - min(pageSize, stackSize);
#else
    context->uc_stack.ss_size = stackSize - sizeof(Impl);
    context->uc_stack.ss_sp = reinterpret_cast<char*>(stack);
#endif
    context->uc_stack.ss_flags = 0;
    // We don't use uc_link since our fiber start routine runs forever in a loop to allow for
    // reuse. When we're done with the fiber, we just destroy it, without switching to it's
    // stack. This is safe since the start routine doesn't allocate any memory or RAII objects
    // before looping.
    context->uc_link = 0;

    return impl;
  }